

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

bool __thiscall FMultiBlockThingsIterator::Next(FMultiBlockThingsIterator *this,CheckResult *item)

{
  uint uVar1;
  ushort uVar2;
  int iVar3;
  FPortalGroupArray *pFVar4;
  double dVar5;
  short sVar6;
  AActor *pAVar7;
  WORD *pWVar8;
  ushort uVar9;
  double dVar10;
  double dVar11;
  
  pAVar7 = FBlockThingsIterator::Next(&this->blockIterator,false);
  while( true ) {
    if (pAVar7 != (AActor *)0x0) {
      item->thing = pAVar7;
      iVar3 = pAVar7->Sector->PortalGroup;
      dVar10 = 0.0;
      dVar11 = 0.0;
      if (iVar3 != this->basegroup) {
        dVar10 = Displacements.data.Array[iVar3 * Displacements.size + (int)this->basegroup].pos.X;
        dVar11 = Displacements.data.Array[iVar3 * Displacements.size + (int)this->basegroup].pos.Y;
      }
      (item->Position).Z = (this->checkpoint).Z;
      dVar5 = (this->checkpoint).Y;
      (item->Position).X = (this->checkpoint).X + dVar10;
      (item->Position).Y = dVar5 + dVar11;
      item->portalflags = (int)this->portalflags;
      return true;
    }
    uVar1 = (int)this->index + 1;
    pFVar4 = this->checklist;
    if ((uint)pFVar4->varused + (pFVar4->data).Count <= uVar1) break;
    pWVar8 = pFVar4->entry + uVar1;
    if (3 < uVar1) {
      pWVar8 = (pFVar4->data).Array + ((int)this->index - 3);
    }
    uVar2 = *pWVar8;
    uVar9 = (ushort)uVar1;
    this->index = uVar9;
    pWVar8 = pFVar4->entry + (uint)(int)(short)uVar9;
    if (3 < uVar9) {
      pWVar8 = (pFVar4->data).Array + ((int)(short)uVar9 - 4);
    }
    startIteratorForGroup(this,*pWVar8 & 0x3fff);
    sVar6 = (ushort)((uVar2 & 0xc000) == 0x4000) << 6;
    if ((uVar2 & 0xc000) == 0x8000) {
      sVar6 = 0x20;
    }
    this->portalflags = sVar6;
    pAVar7 = FBlockThingsIterator::Next(&this->blockIterator,false);
  }
  return false;
}

Assistant:

bool FMultiBlockThingsIterator::Next(FMultiBlockThingsIterator::CheckResult *item)
{
	AActor *thing = blockIterator.Next();
	if (thing != NULL)
	{
		item->thing = thing;
		item->Position = checkpoint + Displacements.getOffset(basegroup, thing->Sector->PortalGroup);
		item->portalflags = portalflags;
		return true;
	}
	bool onlast = unsigned(index + 1) >= checklist.Size();
	int nextflags = onlast ? 0 : checklist[index + 1] & FPortalGroupArray::FLAT;

	if (onlast)
	{
		return false;
	}

	index++;
	startIteratorForGroup(checklist[index] & ~FPortalGroupArray::FLAT);
	switch (nextflags)
	{
	case FPortalGroupArray::UPPER:
		portalflags = FFCF_NOFLOOR;
		break;

	case FPortalGroupArray::LOWER:
		portalflags = FFCF_NOCEILING;
		break;

	default:
		portalflags = 0;
	}

	return Next(item);
}